

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

size_t HTS_fread(void *buf,size_t size,size_t n,HTS_File *fp)

{
  long *plVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  if (((n != 0) && (size != 0)) && (fp != (HTS_File *)0x0)) {
    if (fp->type == '\x01') {
      plVar1 = (long *)fp->pointer;
      uVar4 = 0;
      while ((uVar5 = n * size, n * size - uVar4 != 0 &&
             (uVar2 = plVar1[2], uVar5 = uVar4, uVar2 < (ulong)plVar1[1]))) {
        plVar1[2] = uVar2 + 1;
        *(undefined1 *)((long)buf + uVar4) = *(undefined1 *)(*plVar1 + uVar2);
        uVar4 = uVar4 + 1;
      }
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = uVar5 / size;
      }
    }
    else {
      if (fp->type == '\0') {
        sVar3 = fread(buf,size,n,(FILE *)fp->pointer);
        return sVar3;
      }
      uVar5 = 0;
      HTS_error(0,"HTS_fread: Unknown file type.\n");
    }
  }
  return uVar5;
}

Assistant:

static size_t HTS_fread(void *buf, size_t size, size_t n, HTS_File * fp)
{
   if (fp == NULL || size == 0 || n == 0) {
      return 0;
   }
   if (fp->type == HTS_FILE) {
      return fread(buf, size, n, (FILE *) fp->pointer);
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      size_t i, length = size * n;
      unsigned char *c = (unsigned char *) buf;
      for (i = 0; i < length; i++) {
         if (d->index < d->size)
            c[i] = d->data[d->index++];
         else
            break;
      }
      if (i == 0)
         return 0;
      else
         return i / size;
   }
   HTS_error(0, "HTS_fread: Unknown file type.\n");
   return 0;
}